

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

void penguinV::LookupTable
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *table)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  imageException *this_00;
  LookupTableForm4 p_Var3;
  uint8_t uVar4;
  ImageTypeManager *pIVar5;
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  uint32_t local_138;
  uint32_t local_134;
  uint32_t local_130;
  uint32_t local_12c;
  Image *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ImageManager manager;
  
  local_138 = startXIn;
  local_134 = startYIn;
  local_130 = startXOut;
  local_12c = startYOut;
  local_128 = out;
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in->_type);
  p_Var3 = pFVar2->LookupTable;
  uVar4 = in->_type;
  if (p_Var3 == (LookupTableForm4)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      for (pIVar5 = manager._registrator;
          pIVar5 != (ImageTypeManager *)
                    manager._input.
                    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar5 = (ImageTypeManager *)&(pIVar5->_functionTableMap)._M_t._M_impl.field_0x1) {
        pFVar2 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)&(pIVar5->_functionTableMap)._M_t._M_impl);
        p_Var3 = pFVar2->LookupTable;
        if (p_Var3 != (LookupTableForm4)0x0) {
          uVar4 = *(uint8_t *)&(pIVar5->_functionTableMap)._M_t._M_impl;
          goto LAB_001219a2;
        }
      }
      p_Var3 = (LookupTableForm4)0x0;
LAB_001219a2:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&manager);
      if (p_Var3 != (LookupTableForm4)0x0) goto LAB_001219b8;
    }
    std::__cxx11::string::string((string *)&local_e0,"Function ",&local_139);
    std::__cxx11::string::string((string *)&local_100,"LookupTable",&local_13a);
    std::operator+(&local_c0,&local_e0,&local_100);
    std::__cxx11::string::string((string *)&local_120," is not defined",&local_13b);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&manager,
                   &local_c0,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,(char *)manager._registrator);
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
LAB_001219b8:
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = uVar4;
  (*p_Var3)(in,local_138,local_134,local_128,local_130,local_12c,width,height,table);
  anon_unknown.dwarf_c2d0e::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void LookupTable ( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, const std::vector < uint8_t > & table )
    {
        initialize( in, LookupTable )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, table );
    }